

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,auto_ptr<cmCompiledGeneratorExpression> *outputName,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent)

{
  PolicyStatus policyStatusCMP0070;
  cmGeneratorExpressionEvaluationFile *this_00;
  auto_ptr<cmCompiledGeneratorExpression> local_40;
  auto_ptr<cmCompiledGeneratorExpression> local_38;
  cmGeneratorExpressionEvaluationFile *local_30;
  
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x50);
  local_38 = (auto_ptr<cmCompiledGeneratorExpression>)outputName->x_;
  outputName->x_ = (cmCompiledGeneratorExpression *)0x0;
  local_40 = (auto_ptr<cmCompiledGeneratorExpression>)condition->x_;
  condition->x_ = (cmCompiledGeneratorExpression *)0x0;
  policyStatusCMP0070 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0070);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,inputFile,&local_38,&local_40,inputIsContent,policyStatusCMP0070);
  local_30 = this_00;
  std::
  vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
  ::emplace_back<cmGeneratorExpressionEvaluationFile*>
            ((vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
              *)&this->EvaluationFiles,&local_30);
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_40);
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_38);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> outputName,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> condition, bool inputIsContent)
{
  this->EvaluationFiles.push_back(new cmGeneratorExpressionEvaluationFile(
    inputFile, outputName, condition, inputIsContent,
    this->GetPolicyStatus(cmPolicies::CMP0070)));
}